

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O2

void gray_hline(gray_PWorker worker,TCoord x,TCoord y,TPos area,TCoord acount)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  SW_FT_Span *pSVar7;
  long lVar8;
  long lVar9;
  
  uVar3 = (uint)((ulong)area >> 9);
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  if (((worker->outline).flags & 2) == 0) {
    uVar3 = 0xff;
    if (uVar2 < 0xff) {
      uVar3 = uVar2;
    }
  }
  else {
    uVar2 = uVar2 & 0x1ff;
    if (uVar2 < 0x101) {
      uVar3 = 0xff;
      if (uVar2 != 0x100) {
        uVar3 = uVar2;
      }
    }
    else {
      uVar3 = 0x200 - uVar2;
    }
  }
  lVar4 = y + worker->min_ey;
  lVar9 = x + worker->min_ex;
  if (0x7ffe < lVar9) {
    lVar9 = 0x7fff;
  }
  lVar8 = 0x7fffffff;
  if (lVar4 < 0x7fffffff) {
    lVar8 = lVar4;
  }
  if (uVar3 != 0) {
    if (lVar9 < worker->bound_left) {
      worker->bound_left = (int)lVar9;
    }
    if (lVar4 < worker->bound_top) {
      worker->bound_top = (int)lVar8;
    }
    if (worker->bound_bottom < lVar8) {
      worker->bound_bottom = (int)lVar8;
    }
    if ((long)worker->bound_right < lVar9 + acount) {
      worker->bound_right = (int)(lVar9 + acount);
    }
    uVar2 = worker->num_gray_spans;
    lVar6 = (long)(int)uVar2;
    pSVar7 = worker->gray_spans + lVar6;
    uVar5 = uVar2;
    if (0 < lVar6) {
      if (((lVar4 == worker->gray_spans[lVar6 + -1].y) &&
          (uVar1 = worker->gray_spans[lVar6 + -1].len,
          (int)worker->gray_spans[lVar6 + -1].x + (uint)uVar1 == (int)lVar9)) &&
         (uVar3 == worker->gray_spans[lVar6 + -1].coverage)) {
        worker->gray_spans[lVar6 + -1].len = uVar1 + (unsigned_short)acount;
        return;
      }
      if (0xff < uVar2) {
        pSVar7 = worker->gray_spans;
        uVar5 = 0;
        if (worker->render_span != (SW_FT_SpanFunc)0x0) {
          (*worker->render_span)(uVar2,pSVar7,worker->render_span_data);
          uVar5 = 0;
        }
      }
    }
    pSVar7->x = (short)lVar9;
    pSVar7->y = (short)lVar8;
    pSVar7->len = (unsigned_short)acount;
    pSVar7->coverage = (uchar)uVar3;
    worker->num_gray_spans = uVar5 + 1;
  }
  return;
}

Assistant:

static void gray_hline(RAS_ARG_ TCoord x, TCoord y, TPos area, TCoord acount)
{
    int coverage;

    /* compute the coverage line's coverage, depending on the    */
    /* outline fill rule                                         */
    /*                                                           */
    /* the coverage percentage is area/(PIXEL_BITS*PIXEL_BITS*2) */
    /*                                                           */
    coverage = (int)(area >> (PIXEL_BITS * 2 + 1 - 8));
    /* use range 0..256 */
    if (coverage < 0) coverage = -coverage;

    if (ras.outline.flags & SW_FT_OUTLINE_EVEN_ODD_FILL) {
        coverage &= 511;

        if (coverage > 256)
            coverage = 512 - coverage;
        else if (coverage == 256)
            coverage = 255;
    } else {
        /* normal non-zero winding rule */
        if (coverage >= 256) coverage = 255;
    }

    y += (TCoord)ras.min_ey;
    x += (TCoord)ras.min_ex;

    /* SW_FT_Span.x is a 16-bit short, so limit our coordinates appropriately */
    if (x >= 32767) x = 32767;

    /* SW_FT_Span.y is an integer, so limit our coordinates appropriately */
    if (y >= SW_FT_INT_MAX) y = SW_FT_INT_MAX;

    if (coverage) {
        SW_FT_Span* span;
        int         count;

        // update bounding box.
        if (x < ras.bound_left) ras.bound_left = x;
        if (y < ras.bound_top) ras.bound_top = y;
        if (y > ras.bound_bottom) ras.bound_bottom = y;
        if (x + acount > ras.bound_right) ras.bound_right = x + acount;

        /* see whether we can add this span to the current list */
        count = ras.num_gray_spans;
        span = ras.gray_spans + count - 1;
        if (count > 0 && span->y == y && (int)span->x + span->len == (int)x &&
            span->coverage == coverage) {
            span->len = (unsigned short)(span->len + acount);
            return;
        }

        if (count >= SW_FT_MAX_GRAY_SPANS) {
            if (ras.render_span && count > 0)
                ras.render_span(count, ras.gray_spans, ras.render_span_data);

#ifdef DEBUG_GRAYS

            if (1) {
                int n;

                fprintf(stderr, "count = %3d ", count);
                span = ras.gray_spans;
                for (n = 0; n < count; n++, span++)
                    fprintf(stderr, "[%d , %d..%d] : %d ", span->y, span->x,
                            span->x + span->len - 1, span->coverage);
                fprintf(stderr, "\n");
            }

#endif /* DEBUG_GRAYS */

            ras.num_gray_spans = 0;

            span = ras.gray_spans;
        } else
            span++;

        /* add a gray span to the current list */
        span->x = (short)x;
        span->y = (short)y;
        span->len = (unsigned short)acount;
        span->coverage = (unsigned char)coverage;

        ras.num_gray_spans++;
    }
}